

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O1

ExpEmit __thiscall FxPreIncrDecr::Emit(FxPreIncrDecr *this,VMFunctionBuilder *build)

{
  PType *pPVar1;
  uint16_t uVar2;
  byte bVar3;
  int iVar4;
  uint opc;
  uint uVar5;
  uint extraout_var;
  ExpEmit *pEVar6;
  ExpEmit *pEVar7;
  ExpEmit value;
  ExpEmit pointer;
  ExpEmit local_40;
  ExpEmit local_38;
  
  if (1 < this->Token - 0x119U) {
    __assert_fail("Token == TK_Incr || Token == TK_Decr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                  ,0x80d,"virtual ExpEmit FxPreIncrDecr::Emit(VMFunctionBuilder *)");
  }
  pPVar1 = (this->super_FxExpression).ValueType;
  if (pPVar1 != this->Base->ValueType) {
LAB_00526329:
    __assert_fail("ValueType == Base->ValueType && IsNumeric()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                  ,0x80e,"virtual ExpEmit FxPreIncrDecr::Emit(VMFunctionBuilder *)");
  }
  iVar4 = (*(pPVar1->super_PTypeBase).super_DObject._vptr_DObject[8])();
  if ((char)iVar4 == '\0') goto LAB_00526329;
  opc = VMFunctionBuilder::GetConstantInt(build,0);
  bVar3 = ((this->super_FxExpression).ValueType)->RegType;
  local_40._0_4_ = (*this->Base->_vptr_FxExpression[9])(this->Base,build);
  local_40.Konst = (bool)(char)extraout_var;
  local_40.Fixed = (bool)(char)(extraout_var >> 8);
  local_40.Final = (bool)(char)(extraout_var >> 0x10);
  local_40.Target = (bool)(char)(extraout_var >> 0x18);
  local_38 = local_40;
  if ((extraout_var & 0x1000000) == 0) {
    uVar5 = VMFunctionBuilder::RegAvailability::Get(build->Registers + bVar3,1);
    local_40 = (ExpEmit)((ulong)((uint)bVar3 << 0x10 | uVar5 & 0xffff) | 0x1000000);
    VMFunctionBuilder::Emit
              (build,(uint)((this->super_FxExpression).ValueType)->loadOp,uVar5 & 0xffff,
               (uint)local_38.RegNum,opc);
  }
  uVar2 = local_40.RegNum;
  if ((ulong)bVar3 == 0) {
    uVar5 = 0xff;
    if (this->Token == 0x119) {
      uVar5 = 1;
    }
    iVar4 = 0x65;
  }
  else {
    iVar4 = (uint)(this->Token != 0x119) * 2 + 0x98;
    uVar5 = VMFunctionBuilder::GetConstantFloat(build,1.0);
  }
  VMFunctionBuilder::Emit(build,iVar4,(uint)uVar2,(uint)uVar2,uVar5);
  if ((extraout_var & 0x1000000) == 0) {
    VMFunctionBuilder::Emit
              (build,(uint)((this->super_FxExpression).ValueType)->storeOp,(uint)local_38.RegNum,
               (uint)local_40.RegNum,opc);
  }
  if (this->AddressRequested == true) {
    if (((ulong)local_40 & 0x10000000000) != 0) {
      pEVar7 = &local_38;
      goto LAB_00526317;
    }
    pEVar7 = &local_38;
    if ((~local_40.Konst & local_40.RegType < 4) == 0) goto LAB_00526317;
    pEVar6 = &local_40;
    bVar3 = local_40.RegType;
  }
  else {
    if (((ulong)local_38 & 0x10000000000) != 0) {
      pEVar7 = &local_40;
      goto LAB_00526317;
    }
    pEVar7 = &local_40;
    if ((local_38.RegType < 4 & ~local_38.Konst) != 1) goto LAB_00526317;
    pEVar6 = &local_38;
    bVar3 = local_38.RegType;
  }
  VMFunctionBuilder::RegAvailability::Return
            (build->Registers + bVar3,(uint)pEVar6->RegNum,(uint)pEVar6->RegCount);
LAB_00526317:
  return *pEVar7;
}

Assistant:

ExpEmit FxPreIncrDecr::Emit(VMFunctionBuilder *build)
{
	assert(Token == TK_Incr || Token == TK_Decr);
	assert(ValueType == Base->ValueType && IsNumeric());

	int zero = build->GetConstantInt(0);
	int regtype = ValueType->GetRegType();
	ExpEmit pointer = Base->Emit(build);
	ExpEmit value = pointer;

	if (!pointer.Target)
	{
		value = ExpEmit(build, regtype);
		build->Emit(ValueType->GetLoadOp(), value.RegNum, pointer.RegNum, zero);
	}

	if (regtype == REGT_INT)
	{
		build->Emit(OP_ADDI, value.RegNum, value.RegNum, uint8_t((Token == TK_Incr) ? 1 : -1));
	}
	else
	{
		build->Emit((Token == TK_Incr) ? OP_ADDF_RK : OP_SUBF_RK, value.RegNum, value.RegNum, build->GetConstantFloat(1.));
	}

	if (!pointer.Target)
	{
		build->Emit(ValueType->GetStoreOp(), pointer.RegNum, value.RegNum, zero);
	}

	if (AddressRequested)
	{
		value.Free(build);
		return pointer;
	}

	pointer.Free(build);
	return value;
}